

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O3

uint8_t * svb_decode_scalar(uint32_t *outPtr,uint8_t *keyPtr,uint8_t *dataPtr,uint32_t count)

{
  uint8_t *dataPtr_1;
  uint uVar1;
  long lVar2;
  byte *pbVar3;
  long lVar4;
  uint uVar5;
  uint32_t uVar6;
  
  if (count != 0) {
    uVar1 = (uint)*keyPtr;
    pbVar3 = keyPtr + 1;
    lVar4 = 0;
    uVar5 = 0;
    do {
      if ((char)uVar5 == '\b') {
        uVar1 = (uint)*pbVar3;
        pbVar3 = pbVar3 + 1;
        uVar5 = 0;
      }
      switch(uVar1 >> (uVar5 & 0x1f) & 3) {
      case 0:
        uVar6 = (uint32_t)(byte)*(uint32_t *)dataPtr;
        lVar2 = 1;
        break;
      case 1:
        uVar6 = (uint32_t)(ushort)*(uint32_t *)dataPtr;
        lVar2 = 2;
        break;
      case 2:
        uVar6 = (uint32_t)(uint3)*(uint32_t *)dataPtr;
        lVar2 = 3;
        break;
      case 3:
        uVar6 = *(uint32_t *)dataPtr;
        lVar2 = 4;
      }
      outPtr[lVar4] = uVar6;
      dataPtr = (uint8_t *)((long)dataPtr + lVar2);
      uVar5 = (uint)(byte)((char)uVar5 + 2);
      lVar4 = lVar4 + 1;
    } while (count != (uint32_t)lVar4);
  }
  return dataPtr;
}

Assistant:

uint8_t *svb_decode_scalar(uint32_t *outPtr, const uint8_t *keyPtr,
                           uint8_t *dataPtr, uint32_t count) {
  if (count == 0)
    return dataPtr; // no reads or writes if no data

  uint8_t shift = 0;
  uint32_t key = *keyPtr++;
  for (uint32_t c = 0; c < count; c++) {
    if (shift == 8) {
      shift = 0;
      key = *keyPtr++;
    }
    uint32_t val = _decode_data(&dataPtr, (key >> shift) & 0x3);
    *outPtr++ = val;
    shift += 2;
  }

  return dataPtr; // pointer to first unused byte after end
}